

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_ak13.c
# Opt level: O0

double xc_gga_ak13_get_asymptotic(double homo)

{
  double dVar1;
  double *in_stack_00000038;
  double in_stack_00000040;
  
  dVar1 = xc_gga_ak13_pars_get_asymptotic(in_stack_00000040,in_stack_00000038);
  return dVar1;
}

Assistant:

double xc_gga_ak13_get_asymptotic (double homo)
{
  return xc_gga_ak13_pars_get_asymptotic(homo, par_ak13);
}